

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::ConcurrentDatabase::write_entry
          (ConcurrentDatabase *this,ResourceTag tag,Hash hash,void *blob,size_t blob_size,
          PayloadWriteFlags flags)

{
  int iVar1;
  size_type sVar2;
  DatabaseInterface *pDVar3;
  undefined1 uVar4;
  uint index;
  uint __val;
  DatabaseInterface *pDVar5;
  Hash hash_local;
  ResourceTag local_d0;
  uint local_cc;
  void *local_c8;
  size_t local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  string write_path;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar4 = 0;
  if ((this->mode < ExclusiveOverWrite) && (this->mode != ReadOnly)) {
    hash_local = hash;
    sVar2 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this->primed_hashes[tag]._M_h,&hash_local);
    uVar4 = 1;
    if (sVar2 == 0) {
      pDVar5 = (this->readonly_interface)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if ((pDVar5 != (DatabaseInterface *)0x0) &&
         (iVar1 = (*pDVar5->_vptr_DatabaseInterface[5])(pDVar5,(ulong)tag,hash_local),
         (char)iVar1 != '\0')) {
        return true;
      }
      pDVar5 = (this->writeonly_interface)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if ((pDVar5 != (DatabaseInterface *)0x0) &&
         (iVar1 = (*pDVar5->_vptr_DatabaseInterface[5])(pDVar5,(ulong)tag,hash_local),
         (char)iVar1 != '\0')) {
        return true;
      }
      if (this->need_writeonly_database == false) {
        pDVar5 = (this->writeonly_interface)._M_t.
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      }
      else {
        local_b8 = &this->base_path;
        __val = 1;
        local_d0 = tag;
        local_cc = flags;
        local_c8 = blob;
        local_c0 = blob_size;
        while ((pDVar5 = (this->writeonly_interface)._M_t.
                         super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                         .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl,
               __val < 0x100 && (pDVar5 == (DatabaseInterface *)0x0))) {
          std::operator+(&local_70,local_b8,".");
          std::__cxx11::to_string(&local_90,__val);
          std::operator+(&local_50,&local_70,&local_90);
          std::operator+(&write_path,&local_50,".foz");
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          pDVar3 = create_stream_archive_database(write_path._M_dataplus._M_p,ExclusiveOverWrite);
          pDVar5 = (this->writeonly_interface)._M_t.
                   super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                   .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
          (this->writeonly_interface)._M_t.
          super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
          ._M_t.
          super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
          .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl = pDVar3;
          if (pDVar5 != (DatabaseInterface *)0x0) {
            (*pDVar5->_vptr_DatabaseInterface[1])();
            pDVar3 = (this->writeonly_interface)._M_t.
                     super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                     .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
          }
          iVar1 = (*pDVar3->_vptr_DatabaseInterface[2])(pDVar3);
          if ((char)iVar1 == '\0') {
            pDVar5 = (this->writeonly_interface)._M_t.
                     super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                     .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
            (this->writeonly_interface)._M_t.
            super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
            .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
                 (DatabaseInterface *)0x0;
            if (pDVar5 != (DatabaseInterface *)0x0) {
              (*pDVar5->_vptr_DatabaseInterface[1])();
            }
          }
          std::__cxx11::string::_M_dispose();
          __val = __val + 1;
        }
        this->need_writeonly_database = false;
        blob_size = local_c0;
        blob = local_c8;
        tag = local_d0;
        flags = local_cc;
      }
      if (pDVar5 == (DatabaseInterface *)0x0) {
        uVar4 = 0;
      }
      else {
        iVar1 = (*pDVar5->_vptr_DatabaseInterface[4])
                          (pDVar5,(ulong)tag,hash_local,blob,blob_size,(ulong)flags);
        uVar4 = (undefined1)iVar1;
      }
    }
  }
  return (bool)uVar4;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t blob_size, PayloadWriteFlags flags) override
	{
		if (mode != DatabaseMode::Append &&
		    mode != DatabaseMode::AppendWithReadOnlyAccess &&
		    mode != DatabaseMode::OverWrite)
			return false;

		if (primed_hashes[tag].count(hash))
			return true;

		// All threads must have called prepare and synchronized readonly_interface from that,
		// and from here on out readonly_interface is purely read-only, no need to lock just to check.
		if (readonly_interface && readonly_interface->has_entry(tag, hash))
			return true;

		if (writeonly_interface && writeonly_interface->has_entry(tag, hash))
			return true;

		if (need_writeonly_database)
		{
			// Lazily create a new database. Open the database file exclusively to work concurrently with other processes.
			// Don't try forever.
			for (unsigned index = 1; index < 256 && !writeonly_interface; index++)
			{
				std::string write_path = base_path + "." + std::to_string(index) + ".foz";
				writeonly_interface.reset(create_stream_archive_database(write_path.c_str(), DatabaseMode::ExclusiveOverWrite));
				if (!writeonly_interface->prepare())
					writeonly_interface.reset();
			}

			need_writeonly_database = false;
		}

		if (writeonly_interface)
			return writeonly_interface->write_entry(tag, hash, blob, blob_size, flags);
		else
			return false;
	}